

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void populate_coeffs_6tap_avx2(__m128i coeffs_128,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar9 [16];
  __m256i coeffs_256;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_100;
  undefined8 uStack_f8;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x402),0x402,1);
  auVar1 = vpinsrw_avx(auVar1,0x402,2);
  auVar1 = vpinsrw_avx(auVar1,0x402,3);
  auVar1 = vpinsrw_avx(auVar1,0x402,4);
  auVar1 = vpinsrw_avx(auVar1,0x402,5);
  auVar1 = vpinsrw_avx(auVar1,0x402,6);
  auVar1 = vpinsrw_avx(auVar1,0x402,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x402),0x402,1);
  auVar2 = vpinsrw_avx(auVar2,0x402,2);
  auVar2 = vpinsrw_avx(auVar2,0x402,3);
  auVar2 = vpinsrw_avx(auVar2,0x402,4);
  auVar2 = vpinsrw_avx(auVar2,0x402,5);
  auVar2 = vpinsrw_avx(auVar2,0x402,6);
  auVar2 = vpinsrw_avx(auVar2,0x402,7);
  uStack_1d0 = auVar2._0_8_;
  uStack_1c8 = auVar2._8_8_;
  auVar8._8_8_ = uStack_f8;
  auVar8._0_8_ = local_100;
  auVar8._16_8_ = local_100;
  auVar8._24_8_ = uStack_f8;
  auVar7._16_8_ = uStack_1d0;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_1c8;
  auVar3 = vpshufb_avx2(auVar8,auVar7);
  *in_RDI = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0x806),0x806,1);
  auVar1 = vpinsrw_avx(auVar1,0x806,2);
  auVar1 = vpinsrw_avx(auVar1,0x806,3);
  auVar1 = vpinsrw_avx(auVar1,0x806,4);
  auVar1 = vpinsrw_avx(auVar1,0x806,5);
  auVar1 = vpinsrw_avx(auVar1,0x806,6);
  auVar1 = vpinsrw_avx(auVar1,0x806,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x806),0x806,1);
  auVar2 = vpinsrw_avx(auVar2,0x806,2);
  auVar2 = vpinsrw_avx(auVar2,0x806,3);
  auVar2 = vpinsrw_avx(auVar2,0x806,4);
  auVar2 = vpinsrw_avx(auVar2,0x806,5);
  auVar2 = vpinsrw_avx(auVar2,0x806,6);
  auVar2 = vpinsrw_avx(auVar2,0x806,7);
  uStack_190 = auVar2._0_8_;
  uStack_188 = auVar2._8_8_;
  auVar6._8_8_ = uStack_f8;
  auVar6._0_8_ = local_100;
  auVar6._16_8_ = local_100;
  auVar6._24_8_ = uStack_f8;
  auVar5._16_8_ = uStack_190;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_188;
  auVar3 = vpshufb_avx2(auVar6,auVar5);
  in_RDI[1] = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0xc0a),0xc0a,1);
  auVar1 = vpinsrw_avx(auVar1,0xc0a,2);
  auVar1 = vpinsrw_avx(auVar1,0xc0a,3);
  auVar1 = vpinsrw_avx(auVar1,0xc0a,4);
  auVar1 = vpinsrw_avx(auVar1,0xc0a,5);
  auVar1 = vpinsrw_avx(auVar1,0xc0a,6);
  auVar1 = vpinsrw_avx(auVar1,0xc0a,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xc0a),0xc0a,1);
  auVar2 = vpinsrw_avx(auVar2,0xc0a,2);
  auVar2 = vpinsrw_avx(auVar2,0xc0a,3);
  auVar2 = vpinsrw_avx(auVar2,0xc0a,4);
  auVar2 = vpinsrw_avx(auVar2,0xc0a,5);
  auVar2 = vpinsrw_avx(auVar2,0xc0a,6);
  auVar2 = vpinsrw_avx(auVar2,0xc0a,7);
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_150 = auVar9._0_8_;
  uStack_148 = auVar9._8_8_;
  auVar4._8_8_ = uStack_f8;
  auVar4._0_8_ = local_100;
  auVar4._16_8_ = local_100;
  auVar4._24_8_ = uStack_f8;
  auVar3._16_8_ = uStack_150;
  auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar3._24_8_ = uStack_148;
  auVar3 = vpshufb_avx2(auVar4,auVar3);
  in_RDI[2] = auVar3;
  return;
}

Assistant:

static inline void populate_coeffs_6tap_avx2(const __m128i coeffs_128,
                                             __m256i coeffs[3]) {
  const __m256i coeffs_256 = _mm256_broadcastsi128_si256(coeffs_128);

  // coeffs 1 2 1 2 1 2 1 2
  coeffs[0] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0402u));
  // coeffs 3 4 3 4 3 4 3 4
  coeffs[1] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0806u));
  // coeffs 5 6 5 6 5 6 5 6
  coeffs[2] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0C0Au));
}